

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Orientation * __thiscall
stateObservation::kine::Orientation::setToProductNoAlias
          (Orientation *this,Orientation *R1,Orientation *R2)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  char *__function;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  
  bVar6 = (R1->q_).isSet_.b_;
  if (((bVar6 == false) && ((R1->m_).isSet_.b_ == false)) ||
     ((bVar7 = (R2->q_).isSet_.b_, bVar7 == false && ((R2->m_).isSet_.b_ == false)))) {
    __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
  }
  if ((bVar6 & bVar7) == 1) {
    if (((R1->m_).isSet_.b_ == true) && ((R2->m_).isSet_.b_ == true)) {
      if (((((R1->m_).isSet_.b_ != true) || ((R1->m_).assertMsg_.b_ == (char *)0x0)) ||
          ((R2->m_).isSet_.b_ != true)) || ((R2->m_).assertMsg_.b_ == (char *)0x0))
      goto LAB_0011cf36;
      (this->m_).isSet_.b_ = true;
      lVar9 = 0;
      do {
        dVar2 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar9);
        dVar3 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar9 + 8);
        dVar5 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
        dVar4 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar9 + 0x10);
        dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4];
        dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
        pdVar1 = (double *)
                 ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar9);
        *pdVar1 = dVar4 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[6] +
                  dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[3] +
                  dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0];
        pdVar1[1] = dVar4 * dVar12 + dVar3 * dVar11 + dVar2 * dVar5;
        *(double *)
         ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                .m_data.array + lVar9 + 0x10) =
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8] *
             *(double *)
              ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar9 + 0x10) +
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] *
             *(double *)
              ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar9 + 8) +
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2] *
             *(double *)
              ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar9);
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x48);
    }
    else {
      (this->m_).isSet_.b_ = false;
    }
    if ((((R1->q_).isSet_.b_ == true) && ((R1->q_).assertMsg_.b_ != (char *)0x0)) &&
       (((R2->q_).isSet_.b_ == true && ((R2->q_).assertMsg_.b_ != (char *)0x0)))) {
      dVar2 = (R2->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
      dVar3 = *(double *)
               ((long)(R2->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 8);
      dVar4 = *(double *)
               ((long)(R2->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x10);
      dVar5 = *(double *)
               ((long)(R2->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x18);
      dVar11 = (R1->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0];
      dVar12 = *(double *)
                ((long)(R1->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 8);
      dVar13 = *(double *)
                ((long)(R1->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 0x10);
      dVar14 = *(double *)
                ((long)(R1->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 0x18);
      dVar16 = dVar2 * dVar13 - dVar4 * dVar11;
      auVar15._8_4_ = SUB84(dVar16,0);
      auVar15._0_8_ = dVar3 * dVar13 - dVar5 * dVar11;
      auVar15._12_4_ = (int)((ulong)dVar16 >> 0x20);
      auVar15 = auVar15 ^ _DAT_001200c0;
      dVar16 = dVar11 * dVar2 + dVar13 * dVar4;
      auVar10._8_4_ = SUB84(dVar16,0);
      auVar10._0_8_ = dVar11 * dVar3 + dVar13 * dVar5;
      auVar10._12_4_ = (int)((ulong)dVar16 >> 0x20);
      auVar10 = auVar10 ^ _DAT_00120100;
      (this->q_).isSet_.b_ = true;
      (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = auVar15._0_8_ + dVar4 * dVar12 + dVar2 * dVar14;
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 8) = auVar15._8_8_ + dVar5 * dVar12 + dVar3 * dVar14;
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 0x10) = auVar10._0_8_ + (dVar14 * dVar4 - dVar12 * dVar2);
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 0x18) = auVar10._8_8_ + (dVar14 * dVar5 - dVar12 * dVar3);
      return this;
    }
LAB_0011cf1f:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  else {
    (this->m_).isSet_.b_ = true;
    if ((R1->m_).isSet_.b_ == false) {
      if (((R1->q_).isSet_.b_ != true) || ((R1->q_).assertMsg_.b_ == (char *)0x0))
      goto LAB_0011cf1f;
      dVar2 = (R1->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
      dVar3 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 8);
      dVar11 = dVar3 + dVar3;
      dVar4 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x10);
      dVar14 = dVar4 + dVar4;
      dVar5 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x18);
      dVar13 = dVar2 * (dVar2 + dVar2);
      dVar12 = (dVar2 + dVar2) * dVar5;
      (R1->m_).isSet_.b_ = true;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = 1.0 - (dVar11 * dVar3 + dVar14 * dVar4);
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = dVar2 * dVar11 + dVar5 * dVar14;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = dVar2 * dVar14 - dVar11 * dVar5;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = dVar2 * dVar11 - dVar5 * dVar14;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = 1.0 - (dVar14 * dVar4 + dVar13);
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = dVar3 * dVar14 + dVar12;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = dVar2 * dVar14 + dVar11 * dVar5;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = dVar3 * dVar14 - dVar12;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = 1.0 - (dVar11 * dVar3 + dVar13);
      if (((R2->m_).isSet_.b_ == true) &&
         ((((R2->m_).assertMsg_.b_ != (char *)0x0 && ((this->m_).isSet_.b_ == true)) &&
          ((this->m_).assertMsg_.b_ != (char *)0x0)))) {
        lVar9 = 0;
        do {
          dVar2 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9);
          dVar3 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9 + 8);
          dVar5 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                  .m_data.array[1];
          dVar4 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9 + 0x10);
          dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4];
          dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7];
          pdVar1 = (double *)
                   ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                          .m_storage.m_data.array + lVar9);
          *pdVar1 = dVar4 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[6] +
                    dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[3] +
                    dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[0];
          pdVar1[1] = dVar4 * dVar12 + dVar3 * dVar11 + dVar2 * dVar5;
          *(double *)
           ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + lVar9 + 0x10) =
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9 + 0x10) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9 + 8) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9);
          lVar9 = lVar9 + 0x18;
        } while (lVar9 != 0x48);
        goto LAB_0011cf16;
      }
    }
    else {
      bVar8 = (R1->m_).assertMsg_.b_ != (char *)0x0 & (R1->m_).isSet_.b_;
      if ((R2->m_).isSet_.b_ == false) {
        if (bVar8 != 0) {
          if (((R2->q_).isSet_.b_ != true) || ((R2->q_).assertMsg_.b_ == (char *)0x0))
          goto LAB_0011cf1f;
          dVar2 = (R2->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0];
          dVar3 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 8);
          dVar11 = dVar3 + dVar3;
          dVar4 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 0x10);
          dVar14 = dVar4 + dVar4;
          dVar5 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 0x18);
          dVar13 = dVar2 * (dVar2 + dVar2);
          dVar12 = (dVar2 + dVar2) * dVar5;
          (R2->m_).isSet_.b_ = true;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = 1.0 - (dVar11 * dVar3 + dVar14 * dVar4);
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = dVar2 * dVar11 + dVar5 * dVar14;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = dVar2 * dVar14 - dVar11 * dVar5;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = dVar2 * dVar11 - dVar5 * dVar14;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = 1.0 - (dVar14 * dVar4 + dVar13);
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = dVar3 * dVar14 + dVar12;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] = dVar2 * dVar14 + dVar11 * dVar5;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] = dVar3 * dVar14 - dVar12;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] = 1.0 - (dVar11 * dVar3 + dVar13);
          if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
            lVar9 = 0;
            do {
              dVar2 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar9);
              dVar3 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar9 + 8);
              dVar5 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1];
              dVar4 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar9 + 0x10);
              dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[4];
              dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[7];
              pdVar1 = (double *)
                       ((long)(this->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar9);
              *pdVar1 = dVar4 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[6] +
                        dVar3 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3] +
                        dVar2 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0];
              pdVar1[1] = dVar4 * dVar12 + dVar3 * dVar11 + dVar2 * dVar5;
              *(double *)
               ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar9 + 0x10) =
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8] *
                   *(double *)
                    ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar9 + 0x10) +
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[5] *
                   *(double *)
                    ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar9 + 8) +
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2] *
                   *(double *)
                    ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar9);
              lVar9 = lVar9 + 0x18;
            } while (lVar9 != 0x48);
            goto LAB_0011cf16;
          }
        }
      }
      else if (((bVar8 != 0) && ((R2->m_).isSet_.b_ == true)) &&
              (((R2->m_).assertMsg_.b_ != (char *)0x0 && ((this->m_).assertMsg_.b_ != (char *)0x0)))
              ) {
        lVar9 = 0;
        do {
          dVar2 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9);
          dVar3 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9 + 8);
          dVar5 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                  .m_data.array[1];
          dVar4 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar9 + 0x10);
          dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4];
          dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7];
          pdVar1 = (double *)
                   ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                          .m_storage.m_data.array + lVar9);
          *pdVar1 = dVar4 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[6] +
                    dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[3] +
                    dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[0];
          pdVar1[1] = dVar4 * dVar12 + dVar3 * dVar11 + dVar2 * dVar5;
          *(double *)
           ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + lVar9 + 0x10) =
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9 + 0x10) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9 + 8) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar9);
          lVar9 = lVar9 + 0x18;
        } while (lVar9 != 0x48);
LAB_0011cf16:
        (this->q_).isSet_.b_ = false;
        return this;
      }
    }
LAB_0011cf36:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline const Orientation & Orientation::setToProductNoAlias(const Orientation & R1, const Orientation & R2)
{
  R1.check_();
  R2.check_();
  if(R1.isQuaternionSet() && R2.isQuaternionSet())
  {
    if(R1.isMatrixSet() && R2.isMatrixSet())
    {
      m_.set().noalias() = R1.m_() * R2.m_();
    }
    else
    {
      m_.reset();
    }
    q_ = R1.q_() * R2.q_();
  }
  else
  {
    m_.set(true); /// we set the matrix as initialized before giving the value
    if(!R1.isMatrixSet())
    {
      m_().noalias() = R1.quaternionToMatrix_() * R2.m_();
    }
    else if(!R2.isMatrixSet())
    {
      m_().noalias() = R1.m_() * R2.quaternionToMatrix_();
    }
    else
    {
      m_().noalias() = R1.m_() * R2.m_();
    }
    q_.reset();
  }

  return *this;
}